

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg.cc
# Opt level: O3

bool __thiscall
absl::str_format_internal::anon_unknown_53::ConvertStringArg
          (anon_unknown_53 *this,wchar_t *v,size_t len,FormatConversionSpecImpl conv,
          FormatSinkImpl *sink)

{
  uint uVar1;
  byte bVar2;
  bool bVar3;
  StringPtrConvertResult SVar4;
  wchar_t *pwVar5;
  CompressedTupleImpl<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<char>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
  sink_00;
  byte bVar6;
  undefined8 extraout_RDX;
  byte bVar7;
  long lVar8;
  Storage<unsigned_long,_0UL,_false> SVar9;
  CompressedTupleImpl<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<char>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
  CVar10;
  uint uVar11;
  FormatSinkImpl *this_00;
  string_view value;
  string_view v_00;
  FormatConversionSpecImpl conv_00;
  FixedArray<char,_18446744073709551615UL,_std::allocator<char>_> mb;
  Storage local_140;
  
  this_00 = (FormatSinkImpl *)CONCAT44((int)((ulong)register0x00000080 >> 0x20),conv.precision_);
  sink_00.super_Storage<unsigned_long,_0UL,_false>.value = conv._0_8_;
  local_140.size_alloc_.
  super_CompressedTupleImpl<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<char>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
  .super_Storage<unsigned_long,_0UL,_false>.value =
       (CompressedTupleImpl<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<char>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
        )((long)v * 4);
  local_140.data_ =
       FixedArray<char,_18446744073709551615UL,_std::allocator<char>_>::Storage::InitializeData
                 (&local_140);
  SVar9.value = 0;
  if (v != (wchar_t *)0x0) {
    pwVar5 = (wchar_t *)0x0;
    bVar6 = 0;
    bVar2 = 0;
    CVar10.super_Storage<unsigned_long,_0UL,_false>.value =
         (Storage<unsigned_long,_0UL,_false>)(Storage<unsigned_long,_0UL,_false>)SVar9.value;
    do {
      if ((ulong)local_140.size_alloc_.
                 super_CompressedTupleImpl<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<char>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
                 .super_Storage<unsigned_long,_0UL,_false>.value <=
          (ulong)CVar10.super_Storage<unsigned_long,_0UL,_false>.value) {
        _GLOBAL__N_1::ConvertStringArg();
        conv_00.precision_ = (int)extraout_RDX;
        conv_00.conv_ = SUB81(CVar10.super_Storage<unsigned_long,_0UL,_false>.value,0);
        conv_00.flags_ = (char)((ulong)CVar10.super_Storage<unsigned_long,_0UL,_false>.value >> 8);
        conv_00.length_mod_ =
             (char)((ulong)CVar10.super_Storage<unsigned_long,_0UL,_false>.value >> 0x10);
        conv_00._3_1_ = (char)((ulong)CVar10.super_Storage<unsigned_long,_0UL,_false>.value >> 0x18)
        ;
        conv_00.width_ = (int)((ulong)CVar10.super_Storage<unsigned_long,_0UL,_false>.value >> 0x20)
        ;
        SVar4 = str_format_internal::FormatConvertImpl
                          ((char *)0x0,conv_00,
                           (FormatSinkImpl *)sink_00.super_Storage<unsigned_long,_0UL,_false>.value)
        ;
        return SVar4.value;
      }
      uVar1 = *(uint *)(this + (long)pwVar5 * 4);
      bVar7 = (byte)uVar1;
      if (uVar1 < 0x80) {
        local_140.data_[(long)CVar10.super_Storage<unsigned_long,_0UL,_false>.value] = bVar7;
        lVar8 = 1;
      }
      else if (uVar1 < 0x800) {
        local_140.data_[(long)CVar10.super_Storage<unsigned_long,_0UL,_false>.value] =
             (byte)(uVar1 >> 6) | 0xc0;
        local_140.data_[(long)((long)CVar10.super_Storage<unsigned_long,_0UL,_false>.value + 1)] =
             bVar7 & 0x3f | 0x80;
        lVar8 = 2;
      }
      else if (uVar1 < 0xd800 || (uVar1 & 0xffffe000) == 0xe000) {
        local_140.data_[(long)CVar10.super_Storage<unsigned_long,_0UL,_false>.value] =
             (byte)(uVar1 >> 0xc) | 0xe0;
        local_140.data_[(long)((long)CVar10.super_Storage<unsigned_long,_0UL,_false>.value + 1)] =
             (byte)(uVar1 >> 6) & 0x3f | 0x80;
        local_140.data_[(long)((long)CVar10.super_Storage<unsigned_long,_0UL,_false>.value + 2)] =
             bVar7 & 0x3f | 0x80;
        lVar8 = 3;
      }
      else if (uVar1 - 0x10000 < 0x100000) {
        local_140.data_[(long)CVar10.super_Storage<unsigned_long,_0UL,_false>.value] =
             (byte)(uVar1 >> 0x12) | 0xf0;
        local_140.data_[(long)((long)CVar10.super_Storage<unsigned_long,_0UL,_false>.value + 1)] =
             (byte)(uVar1 >> 0xc) & 0x3f | 0x80;
        local_140.data_[(long)((long)CVar10.super_Storage<unsigned_long,_0UL,_false>.value + 2)] =
             (byte)(uVar1 >> 6) & 0x3f | 0x80;
        local_140.data_[(long)((long)CVar10.super_Storage<unsigned_long,_0UL,_false>.value + 3)] =
             bVar7 & 0x3f | 0x80;
        lVar8 = 4;
      }
      else if (uVar1 < 0xdc00) {
        bVar6 = bVar7 & 3;
        uVar11 = (uVar1 >> 6 & 0xf) + 1;
        local_140.data_[(long)CVar10.super_Storage<unsigned_long,_0UL,_false>.value] =
             (byte)uVar11 >> 2 | 0xf0;
        local_140.data_[(long)((long)CVar10.super_Storage<unsigned_long,_0UL,_false>.value + 1)] =
             (byte)(uVar1 >> 2) & 0xf | (byte)((uVar11 & 3) << 4) | 0x80;
        lVar8 = 2;
        bVar2 = 1;
      }
      else {
        if (!(bool)(uVar1 < 0xe000 & bVar2)) {
          bVar3 = false;
          goto LAB_0015534d;
        }
        local_140.data_[(long)CVar10.super_Storage<unsigned_long,_0UL,_false>.value] =
             (byte)(uVar1 >> 6) & 0xf | bVar6 << 4 | 0x80;
        local_140.data_[(long)((long)CVar10.super_Storage<unsigned_long,_0UL,_false>.value + 1)] =
             bVar7 & 0x3f | 0x80;
        lVar8 = 2;
        bVar2 = 0;
        bVar6 = 0;
      }
      SVar9 = lVar8 + CVar10.super_Storage<unsigned_long,_0UL,_false>.value;
      pwVar5 = (wchar_t *)((long)pwVar5 + 1);
      sink_00.super_Storage<unsigned_long,_0UL,_false>.value =
           CVar10.super_Storage<unsigned_long,_0UL,_false>.value;
      CVar10.super_Storage<unsigned_long,_0UL,_false>.value =
           (Storage<unsigned_long,_0UL,_false>)(Storage<unsigned_long,_0UL,_false>)SVar9.value;
    } while (v != pwVar5);
  }
  bVar2 = (byte)(len >> 8);
  if (bVar2 == 0) {
    v_00._M_str = local_140.data_;
    v_00._M_len = SVar9.value;
    FormatSinkImpl::Append(this_00,v_00);
    bVar3 = true;
  }
  else {
    value._M_str = local_140.data_;
    value._M_len = SVar9.value;
    bVar3 = FormatSinkImpl::PutPaddedString
                      (this_00,value,(int)(len >> 0x20),conv._0_4_,(bool)(bVar2 & 1));
  }
LAB_0015534d:
  if (0x100 < (ulong)local_140.size_alloc_.
                     super_CompressedTupleImpl<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<char>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
                     .super_Storage<unsigned_long,_0UL,_false>.value) {
    operator_delete(local_140.data_,
                    (ulong)local_140.size_alloc_.
                           super_CompressedTupleImpl<absl::container_internal::CompressedTuple<unsigned_long,_std::allocator<char>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL>,_true>
                           .super_Storage<unsigned_long,_0UL,_false>.value);
  }
  return bVar3;
}

Assistant:

inline bool ConvertStringArg(const wchar_t *v,
                             size_t len,
                             const FormatConversionSpecImpl conv,
                             FormatSinkImpl *sink) {
  FixedArray<char> mb(len * 4);
  ShiftState s;
  size_t chars_written = 0;
  for (size_t i = 0; i < len; ++i) {
    const size_t chars = WideToUtf8(v[i], &mb[chars_written], s);
    if (chars == static_cast<size_t>(-1)) { return false; }
    chars_written += chars;
  }
  return ConvertStringArg(string_view(mb.data(), chars_written), conv, sink);
}